

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

void SSL_get0_ech_retry_configs(SSL *ssl,uint8_t **out_retry_configs,size_t *out_retry_configs_len)

{
  pointer pSVar1;
  uchar *puVar2;
  size_t sVar3;
  SSL_HANDSHAKE *hs;
  size_t *out_retry_configs_len_local;
  uint8_t **out_retry_configs_local;
  SSL *ssl_local;
  
  pSVar1 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::get(&ssl->s3->hs);
  if ((pSVar1 != (pointer)0x0) && ((*(uint *)&pSVar1->field_0x6c8 >> 1 & 1) != 0)) {
    puVar2 = bssl::Array<unsigned_char>::data(&pSVar1->ech_retry_configs);
    *out_retry_configs = puVar2;
    sVar3 = bssl::Array<unsigned_char>::size(&pSVar1->ech_retry_configs);
    *out_retry_configs_len = sVar3;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                ,0x3bf,"void SSL_get0_ech_retry_configs(const SSL *, const uint8_t **, size_t *)");
}

Assistant:

void SSL_get0_ech_retry_configs(const SSL *ssl,
                                const uint8_t **out_retry_configs,
                                size_t *out_retry_configs_len) {
  const SSL_HANDSHAKE *hs = ssl->s3->hs.get();
  if (!hs || !hs->ech_authenticated_reject) {
    // It is an error to call this function except in response to
    // |SSL_R_ECH_REJECTED|. Returning an empty string risks the caller
    // mistakenly believing the server has disabled ECH. Instead, return a
    // non-empty ECHConfigList with a syntax error, so the subsequent
    // |SSL_set1_ech_config_list| call will fail.
    assert(0);
    static const uint8_t kPlaceholder[] = {
        kECHConfigVersion >> 8, kECHConfigVersion & 0xff, 0xff, 0xff, 0xff};
    *out_retry_configs = kPlaceholder;
    *out_retry_configs_len = sizeof(kPlaceholder);
    return;
  }

  *out_retry_configs = hs->ech_retry_configs.data();
  *out_retry_configs_len = hs->ech_retry_configs.size();
}